

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

int cinemo::args::processArgs
              (int argc,char **argv,Options *options,
              vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *lw)

{
  bool bVar1;
  long lVar2;
  ostream *poVar3;
  int iVar4;
  allocator local_b1;
  string workDir;
  string arg1;
  string local_70 [32];
  string arg2;
  
  workDir._M_dataplus._M_p = (pointer)&workDir.field_2;
  workDir._M_string_length = 0;
  arg1._M_dataplus._M_p = (pointer)&arg1.field_2;
  arg1._M_string_length = 0;
  arg2._M_dataplus._M_p = (pointer)&arg2.field_2;
  arg2._M_string_length = 0;
  workDir.field_2._M_local_buf[0] = '\0';
  arg1.field_2._M_local_buf[0] = '\0';
  arg2.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&workDir);
  if (argc == 1) {
LAB_00103cad:
    getWorkingDirectoryFromExec(&workDir);
  }
  else if ((argc & 0xfffffffeU) == 2) {
    std::__cxx11::string::string(local_70,argv[1],&local_b1);
    std::__cxx11::string::operator=((string *)&arg1,local_70);
    std::__cxx11::string::~string(local_70);
    lVar2 = std::__cxx11::string::find((char *)&arg1,0x108034);
    if (lVar2 == 0) {
      iVar4 = 0;
      lVar2 = std::__cxx11::string::find((char *)&arg1,0x10807c);
      if (lVar2 == 1) {
        printUsage();
        goto LAB_00103d4b;
      }
      iVar4 = 0;
      lVar2 = std::__cxx11::string::find((char *)&arg1,0x10837c);
      if (lVar2 == 1) {
        wh::printFlags();
        goto LAB_00103d4b;
      }
      lVar2 = std::__cxx11::string::find((char *)&arg1,0x10844e);
      if (lVar2 == 1) {
        options->verbose = true;
        if (2 < (uint)argc) {
          std::__cxx11::string::string(local_70,argv[2],&local_b1);
LAB_00103e3a:
          std::__cxx11::string::operator=((string *)&workDir,local_70);
          std::__cxx11::string::~string(local_70);
          goto LAB_00103cb7;
        }
      }
      else {
        lVar2 = std::__cxx11::string::find((char *)&arg1,0x10870d);
        if (lVar2 != 1) {
          poVar3 = std::operator<<((ostream *)&std::cout,"Invalid option \'");
          poVar3 = std::operator<<(poVar3,(string *)&arg1);
          poVar3 = std::operator<<(poVar3,"\'. Use -h for usage.");
          std::endl<char,std::char_traits<char>>(poVar3);
          iVar4 = 1;
          goto LAB_00103d4b;
        }
        options->noThread = true;
        if (2 < (uint)argc) {
          std::__cxx11::string::string(local_70,argv[2],&local_b1);
          goto LAB_00103e3a;
        }
      }
    }
    else {
      std::__cxx11::string::string(local_70,argv[1],&local_b1);
      std::__cxx11::string::operator=((string *)&workDir,local_70);
      std::__cxx11::string::~string(local_70);
    }
    goto LAB_00103cad;
  }
LAB_00103cb7:
  bVar1 = isValidWorkDirectory(&workDir);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Looking for wave files in ");
    poVar3 = std::operator<<(poVar3,(string *)&workDir);
    std::endl<char,std::char_traits<char>>(poVar3);
    bVar1 = getWaveFiles(&workDir,lw);
    if (!bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Can not find any WAV file(s) in ");
      poVar3 = std::operator<<(poVar3,(string *)&workDir);
      goto LAB_00103d40;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)&workDir);
    poVar3 = std::operator<<(poVar3," Is not a directory.");
LAB_00103d40:
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  iVar4 = 0;
LAB_00103d4b:
  std::__cxx11::string::~string((string *)&arg2);
  std::__cxx11::string::~string((string *)&arg1);
  std::__cxx11::string::~string((string *)&workDir);
  return iVar4;
}

Assistant:

int args::processArgs(int argc, char* argv[], args::Options& options,
                          vector<LameWrapper*>& lw) {

        string workDir;
        string arg1;
        string arg2;

        //FIXME I know I might be blamed for this mess, but later I'll use getopt header
        workDir = argv[0];

        if (argc == 1) {

#ifdef WIN32
            //If no arguments given, this code finds the current exe directory
            //FIXME this assumes system is not UNICODE
            HMODULE hModule = GetModuleHandleW(nullptr);
            WCHAR buffer[MAX_PATH];
            GetModuleFileNameW(hModule, buffer, MAX_PATH);
            char path[MAX_PATH * 2];
            std::wcstombs(path, buffer, MAX_PATH * 2);
            string exePath(path);
            int rIndex = exePath.find_last_of(PATH_SEPARATOR);
            if(rIndex == 0 || rIndex == string::npos) {
                cout << "Can not determine the current executable directory,"
                    << " please pass the directory as an argument."
                    << " Use -h for more information.";
                return 1;
            }
            workDir = exePath.substr(0, rIndex);
#endif
            getWorkingDirectoryFromExec(workDir);
        } else if (argc == 2 || argc == 3) {
            arg1 = string(argv[1]);
            if (arg1.find("-") == 0) {
                if (arg1.find("h") == 1) {
                    args::printUsage();
                    return 0;
                } else if (arg1.find("e") == 1) {
                    wh::printFlags();
                    return 0;
                } else if (arg1.find("v") == 1) {
                    options.verbose = true;
                    if (argc < 3) {
                        getWorkingDirectoryFromExec(workDir);
                    } else if (argc == 3) {
                        workDir = string(argv[2]);
                    }
                } else if (arg1.find("n") == 1) {
                    options.noThread = true;
                    if (argc < 3) {
                        getWorkingDirectoryFromExec(workDir);
                    } else if (argc == 3) {
                        workDir = string(argv[2]);
                    }
                } else {
                    cout << "Invalid option '" << arg1
                         << "'. Use -h for usage." << endl;
                    return 1;
                }
            } else {
                workDir = string(argv[1]);
                getWorkingDirectoryFromExec(workDir);
            }
        }

        if (isValidWorkDirectory(workDir)) {
            cout << "Looking for wave files in " << workDir << endl;
            if (!getWaveFiles(workDir, lw)) {
                cout << "Can not find any WAV file(s) in " << workDir << endl;
            }
        } else {
            cout << workDir << " Is not a directory." << endl;
        }

        return 0;
    }